

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextureBaseGL.cpp
# Opt level: O2

void __thiscall Diligent::TextureBaseGL::SetDefaultGLParameters(TextureBaseGL *this)

{
  TEXTURE_FORMAT TVar1;
  GLenum GVar2;
  undefined8 uVar3;
  GLint BoundTex;
  string msg;
  GLenum err;
  GLuint local_54;
  string local_50;
  uint local_2c;
  
  GVar2 = this->m_BindTarget;
  if (GVar2 == 0xde0) {
    uVar3 = 0x8068;
  }
  else if (GVar2 == 0xde1) {
    uVar3 = 0x8069;
  }
  else if (GVar2 == 0x806f) {
    uVar3 = 0x806a;
  }
  else if (GVar2 == 0x8513) {
    uVar3 = 0x8514;
  }
  else if (GVar2 == 0x9102) {
    uVar3 = 0x9105;
  }
  else if (GVar2 == 0x8c1a) {
    uVar3 = 0x8c1d;
  }
  else if (GVar2 == 0x9009) {
    uVar3 = 0x900a;
  }
  else if (GVar2 == 0x9100) {
    uVar3 = 0x9104;
  }
  else if (GVar2 == 0x8c18) {
    uVar3 = 0x8c1c;
  }
  else {
    FormatString<char[20]>(&local_50,(char (*) [20])"Unknown bind target");
    DebugAssertionFailed
              (local_50._M_dataplus._M_p,"SetDefaultGLParameters",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureBaseGL.cpp"
               ,0x31a);
    std::__cxx11::string::~string((string *)&local_50);
    uVar3 = 0;
  }
  glGetIntegerv(uVar3,&local_54);
  local_2c = glGetError();
  if (local_2c != 0) {
    LogError<false,char[54],char[17],unsigned_int>
              (false,"SetDefaultGLParameters",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureBaseGL.cpp"
               ,0x31e,(char (*) [54])"Failed to set GL_TEXTURE_MIN_FILTER texture parameter",
               (char (*) [17])"\nGL Error Code: ",&local_2c);
    FormatString<char[6]>(&local_50,(char (*) [6])0x731c01);
    DebugAssertionFailed
              (local_50._M_dataplus._M_p,"SetDefaultGLParameters",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureBaseGL.cpp"
               ,0x31e);
    std::__cxx11::string::~string((string *)&local_50);
  }
  if (local_54 != (this->m_GlTexture).m_uiHandle) {
    FormatString<char[43]>(&local_50,(char (*) [43])"Current texture is not bound to GL context");
    DebugAssertionFailed
              (local_50._M_dataplus._M_p,"SetDefaultGLParameters",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureBaseGL.cpp"
               ,799);
    std::__cxx11::string::~string((string *)&local_50);
  }
  TVar1 = (this->super_TextureBase<Diligent::EngineGLImplTraits>).
          super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
          .m_Desc.Format;
  if (TVar1 == TEX_FORMAT_BGRA8_UNORM) {
    glTexParameteri(this->m_BindTarget,0x8e42,0x1905);
    local_54 = glGetError();
    if (local_54 != 0) {
      LogError<false,char[53],char[17],unsigned_int>
                (false,"SetDefaultGLParameters",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureBaseGL.cpp"
                 ,0x335,(char (*) [53])"Failed to set GL_TEXTURE_SWIZZLE_R texture parameter",
                 (char (*) [17])"\nGL Error Code: ",&local_54);
      FormatString<char[6]>(&local_50,(char (*) [6])0x731c01);
      DebugAssertionFailed
                (local_50._M_dataplus._M_p,"SetDefaultGLParameters",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureBaseGL.cpp"
                 ,0x335);
      std::__cxx11::string::~string((string *)&local_50);
    }
    glTexParameteri(this->m_BindTarget,0x8e43,0x1904);
    local_54 = glGetError();
    if (local_54 != 0) {
      LogError<false,char[53],char[17],unsigned_int>
                (false,"SetDefaultGLParameters",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureBaseGL.cpp"
                 ,0x337,(char (*) [53])"Failed to set GL_TEXTURE_SWIZZLE_G texture parameter",
                 (char (*) [17])"\nGL Error Code: ",&local_54);
      FormatString<char[6]>(&local_50,(char (*) [6])0x731c01);
      DebugAssertionFailed
                (local_50._M_dataplus._M_p,"SetDefaultGLParameters",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureBaseGL.cpp"
                 ,0x337);
      std::__cxx11::string::~string((string *)&local_50);
    }
    glTexParameteri(this->m_BindTarget,0x8e44,0x1903);
    local_54 = glGetError();
    if (local_54 != 0) {
      LogError<false,char[53],char[17],unsigned_int>
                (false,"SetDefaultGLParameters",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureBaseGL.cpp"
                 ,0x339,(char (*) [53])"Failed to set GL_TEXTURE_SWIZZLE_B texture parameter",
                 (char (*) [17])"\nGL Error Code: ",&local_54);
      FormatString<char[6]>(&local_50,(char (*) [6])0x731c01);
      DebugAssertionFailed
                (local_50._M_dataplus._M_p,"SetDefaultGLParameters",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureBaseGL.cpp"
                 ,0x339);
      std::__cxx11::string::~string((string *)&local_50);
    }
    glTexParameteri(this->m_BindTarget,0x8e45,0x1906);
    local_54 = glGetError();
    if (local_54 == 0) goto LAB_002ec07b;
    LogError<false,char[53],char[17],unsigned_int>
              (false,"SetDefaultGLParameters",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureBaseGL.cpp"
               ,0x33b,(char (*) [53])"Failed to set GL_TEXTURE_SWIZZLE_A texture parameter",
               (char (*) [17])"\nGL Error Code: ",&local_54);
    FormatString<char[6]>(&local_50,(char (*) [6])0x731c01);
    DebugAssertionFailed
              (local_50._M_dataplus._M_p,"SetDefaultGLParameters",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureBaseGL.cpp"
               ,0x33b);
  }
  else {
    if (TVar1 != TEX_FORMAT_A8_UNORM) goto LAB_002ec07b;
    glTexParameteri(this->m_BindTarget,0x8e42,0);
    local_54 = glGetError();
    if (local_54 != 0) {
      LogError<false,char[53],char[17],unsigned_int>
                (false,"SetDefaultGLParameters",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureBaseGL.cpp"
                 ,0x328,(char (*) [53])"Failed to set GL_TEXTURE_SWIZZLE_R texture parameter",
                 (char (*) [17])"\nGL Error Code: ",&local_54);
      FormatString<char[6]>(&local_50,(char (*) [6])0x731c01);
      DebugAssertionFailed
                (local_50._M_dataplus._M_p,"SetDefaultGLParameters",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureBaseGL.cpp"
                 ,0x328);
      std::__cxx11::string::~string((string *)&local_50);
    }
    glTexParameteri(this->m_BindTarget,0x8e43,0);
    local_54 = glGetError();
    if (local_54 != 0) {
      LogError<false,char[53],char[17],unsigned_int>
                (false,"SetDefaultGLParameters",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureBaseGL.cpp"
                 ,0x32a,(char (*) [53])"Failed to set GL_TEXTURE_SWIZZLE_G texture parameter",
                 (char (*) [17])"\nGL Error Code: ",&local_54);
      FormatString<char[6]>(&local_50,(char (*) [6])0x731c01);
      DebugAssertionFailed
                (local_50._M_dataplus._M_p,"SetDefaultGLParameters",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureBaseGL.cpp"
                 ,0x32a);
      std::__cxx11::string::~string((string *)&local_50);
    }
    glTexParameteri(this->m_BindTarget,0x8e44,0);
    local_54 = glGetError();
    if (local_54 != 0) {
      LogError<false,char[53],char[17],unsigned_int>
                (false,"SetDefaultGLParameters",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureBaseGL.cpp"
                 ,0x32c,(char (*) [53])"Failed to set GL_TEXTURE_SWIZZLE_B texture parameter",
                 (char (*) [17])"\nGL Error Code: ",&local_54);
      FormatString<char[6]>(&local_50,(char (*) [6])0x731c01);
      DebugAssertionFailed
                (local_50._M_dataplus._M_p,"SetDefaultGLParameters",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureBaseGL.cpp"
                 ,0x32c);
      std::__cxx11::string::~string((string *)&local_50);
    }
    glTexParameteri(this->m_BindTarget,0x8e45,0x1903);
    local_54 = glGetError();
    if (local_54 == 0) goto LAB_002ec07b;
    LogError<false,char[53],char[17],unsigned_int>
              (false,"SetDefaultGLParameters",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureBaseGL.cpp"
               ,0x32e,(char (*) [53])"Failed to set GL_TEXTURE_SWIZZLE_A texture parameter",
               (char (*) [17])"\nGL Error Code: ",&local_54);
    FormatString<char[6]>(&local_50,(char (*) [6])0x731c01);
    DebugAssertionFailed
              (local_50._M_dataplus._M_p,"SetDefaultGLParameters",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureBaseGL.cpp"
               ,0x32e);
  }
  std::__cxx11::string::~string((string *)&local_50);
LAB_002ec07b:
  if ((this->m_BindTarget | 2) != 0x9102) {
    glTexParameteri(this->m_BindTarget,0x2801,0x2600);
    local_54 = glGetError();
    if (local_54 != 0) {
      LogError<false,char[54],char[17],unsigned_int>
                (false,"SetDefaultGLParameters",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureBaseGL.cpp"
                 ,0x349,(char (*) [54])"Failed to set GL_TEXTURE_MIN_FILTER texture parameter",
                 (char (*) [17])"\nGL Error Code: ",&local_54);
      FormatString<char[6]>(&local_50,(char (*) [6])0x731c01);
      DebugAssertionFailed
                (local_50._M_dataplus._M_p,"SetDefaultGLParameters",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureBaseGL.cpp"
                 ,0x349);
      std::__cxx11::string::~string((string *)&local_50);
    }
    glTexParameteri(this->m_BindTarget,0x2800,0x2600);
    local_54 = glGetError();
    if (local_54 != 0) {
      LogError<false,char[54],char[17],unsigned_int>
                (false,"SetDefaultGLParameters",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureBaseGL.cpp"
                 ,0x34d,(char (*) [54])"Failed to set GL_TEXTURE_MAG_FILTER texture parameter",
                 (char (*) [17])"\nGL Error Code: ",&local_54);
      FormatString<char[6]>(&local_50,(char (*) [6])0x731c01);
      DebugAssertionFailed
                (local_50._M_dataplus._M_p,"SetDefaultGLParameters",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureBaseGL.cpp"
                 ,0x34d);
      std::__cxx11::string::~string((string *)&local_50);
    }
  }
  return;
}

Assistant:

void TextureBaseGL::SetDefaultGLParameters()
{
#ifdef DILIGENT_DEBUG
    {
        GLint BoundTex;
        GLint TextureBinding = 0;
        switch (m_BindTarget)
        {
                // clang-format off
            case GL_TEXTURE_1D:                     TextureBinding = GL_TEXTURE_BINDING_1D;                   break;
            case GL_TEXTURE_1D_ARRAY:               TextureBinding = GL_TEXTURE_BINDING_1D_ARRAY;             break;
            case GL_TEXTURE_2D:                     TextureBinding = GL_TEXTURE_BINDING_2D;                   break;
            case GL_TEXTURE_2D_ARRAY:               TextureBinding = GL_TEXTURE_BINDING_2D_ARRAY;             break;
            case GL_TEXTURE_2D_MULTISAMPLE:         TextureBinding = GL_TEXTURE_BINDING_2D_MULTISAMPLE;       break;
            case GL_TEXTURE_2D_MULTISAMPLE_ARRAY:   TextureBinding = GL_TEXTURE_BINDING_2D_MULTISAMPLE_ARRAY; break;
            case GL_TEXTURE_3D:                     TextureBinding = GL_TEXTURE_BINDING_3D;                   break;
            case GL_TEXTURE_CUBE_MAP:               TextureBinding = GL_TEXTURE_BINDING_CUBE_MAP;             break;
            case GL_TEXTURE_CUBE_MAP_ARRAY:         TextureBinding = GL_TEXTURE_BINDING_CUBE_MAP_ARRAY;       break;
            default: UNEXPECTED("Unknown bind target");
                // clang-format on
        }
        glGetIntegerv(TextureBinding, &BoundTex);
        DEV_CHECK_GL_ERROR("Failed to set GL_TEXTURE_MIN_FILTER texture parameter");
        VERIFY(static_cast<GLuint>(BoundTex) == m_GlTexture, "Current texture is not bound to GL context");
    }
#endif

    if (m_Desc.Format == TEX_FORMAT_A8_UNORM)
    {
        // We need to do channel swizzling since TEX_FORMAT_A8_UNORM
        // is actually implemented using GL_RED
        glTexParameteri(m_BindTarget, GL_TEXTURE_SWIZZLE_R, GL_ZERO);
        DEV_CHECK_GL_ERROR("Failed to set GL_TEXTURE_SWIZZLE_R texture parameter");
        glTexParameteri(m_BindTarget, GL_TEXTURE_SWIZZLE_G, GL_ZERO);
        DEV_CHECK_GL_ERROR("Failed to set GL_TEXTURE_SWIZZLE_G texture parameter");
        glTexParameteri(m_BindTarget, GL_TEXTURE_SWIZZLE_B, GL_ZERO);
        DEV_CHECK_GL_ERROR("Failed to set GL_TEXTURE_SWIZZLE_B texture parameter");
        glTexParameteri(m_BindTarget, GL_TEXTURE_SWIZZLE_A, GL_RED);
        DEV_CHECK_GL_ERROR("Failed to set GL_TEXTURE_SWIZZLE_A texture parameter");
    }
    else if (m_Desc.Format == TEX_FORMAT_BGRA8_UNORM)
    {
        // We need to do channel swizzling since TEX_FORMAT_BGRA8_UNORM
        // is actually implemented using GL_RGBA
        glTexParameteri(m_BindTarget, GL_TEXTURE_SWIZZLE_R, GL_BLUE);
        DEV_CHECK_GL_ERROR("Failed to set GL_TEXTURE_SWIZZLE_R texture parameter");
        glTexParameteri(m_BindTarget, GL_TEXTURE_SWIZZLE_G, GL_GREEN);
        DEV_CHECK_GL_ERROR("Failed to set GL_TEXTURE_SWIZZLE_G texture parameter");
        glTexParameteri(m_BindTarget, GL_TEXTURE_SWIZZLE_B, GL_RED);
        DEV_CHECK_GL_ERROR("Failed to set GL_TEXTURE_SWIZZLE_B texture parameter");
        glTexParameteri(m_BindTarget, GL_TEXTURE_SWIZZLE_A, GL_ALPHA);
        DEV_CHECK_GL_ERROR("Failed to set GL_TEXTURE_SWIZZLE_A texture parameter");
    }

    if (m_BindTarget != GL_TEXTURE_2D_MULTISAMPLE &&
        m_BindTarget != GL_TEXTURE_2D_MULTISAMPLE_ARRAY)
    {
        // Note that texture bound to image unit must be complete.
        // That means that if an integer texture is being bound, its
        // GL_TEXTURE_MIN_FILTER and GL_TEXTURE_MAG_FILTER must be NEAREST,
        // otherwise it will be incomplete

        // The default value of GL_TEXTURE_MIN_FILTER is GL_NEAREST_MIPMAP_LINEAR
        // Reset it to GL_NEAREST to avoid incompleteness issues with integer textures
        glTexParameteri(m_BindTarget, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
        DEV_CHECK_GL_ERROR("Failed to set GL_TEXTURE_MIN_FILTER texture parameter");

        // The default value of GL_TEXTURE_MAG_FILTER is GL_LINEAR
        glTexParameteri(m_BindTarget, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
        DEV_CHECK_GL_ERROR("Failed to set GL_TEXTURE_MAG_FILTER texture parameter");
    }
}